

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_extractor.cpp
# Opt level: O3

bool r_exec::Input::IsEligibleCause(View *view)

{
  SyncMode SVar1;
  
  SVar1 = r_exec::View::get_sync(view);
  return SVar1 + ~SYNC_ONCE_AXIOM < 0xfffffffe;
}

Assistant:

bool Input::IsEligibleCause(r_exec::View *view)
{
    switch (view->get_sync()) {
    case View::SYNC_AXIOM:
    case View::SYNC_ONCE_AXIOM:
        return false;

    default:
        return true;
    }
}